

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O2

void __thiscall DBaseStatusBar::DrawLog(DBaseStatusBar *this)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  FBrokenLines *lines;
  long lVar7;
  long lVar8;
  FBrokenLines *pFVar9;
  long lVar10;
  FString *pFVar11;
  long lVar12;
  int iVar13;
  
  if (*(int *)((this->CPlayer->LogText).Chars + -0xc) != 0) {
    iVar2 = active_con_scaletext();
    iVar5 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
    if (iVar2 == 0) {
      uVar4 = (screen->super_DSimpleCanvas).super_DCanvas.Height / CleanYfac;
      iVar2 = CleanXfac;
    }
    else {
      iVar2 = active_con_scaletext();
      iVar13 = (screen->super_DSimpleCanvas).super_DCanvas.Height;
      iVar3 = active_con_scaletext();
      uVar4 = iVar13 / iVar3;
    }
    uVar1 = (long)iVar5 / (long)iVar2;
    uVar6 = uVar1 & 0xffffffff;
    iVar2 = 0x230;
    iVar5 = (int)uVar1;
    lVar12 = (long)iVar5;
    if (iVar5 < 0x280) {
      iVar2 = (int)((lVar12 * 9) / 10) + -0x28;
    }
    lines = V_BreakLines(SmallFont,iVar2,&this->CPlayer->LogText,false);
    iVar13 = 0x14;
    for (pFVar9 = lines; pFVar9->Width != -1; pFVar9 = pFVar9 + 1) {
      iVar13 = iVar13 + SmallFont->FontHeight + 1;
    }
    if (iVar2 < 0x230) {
      iVar3 = (int)((long)((ulong)(uint)(iVar5 >> 0x1f) << 0x20 | uVar6) / 0x14);
      iVar2 = (int)uVar4 / 8;
      lVar10 = (long)(iVar5 + iVar3 * -2);
    }
    else {
      iVar3 = (iVar5 >> 1) + -300;
      iVar5 = (int)(uVar4 * 3) / 10 - (iVar13 >> 1);
      iVar2 = 0;
      if (0 < iVar5) {
        iVar2 = iVar5;
      }
      lVar10 = 600;
    }
    lVar7 = (long)(screen->super_DSimpleCanvas).super_DCanvas.Width;
    lVar8 = (long)(screen->super_DSimpleCanvas).super_DCanvas.Height;
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xe])
              (0x3f000000,screen,0,(lVar7 * iVar3) / lVar12 & 0xffffffff,
               (lVar8 * iVar2) / (long)(int)uVar4 & 0xffffffff,
               (lVar10 * lVar7) / lVar12 & 0xffffffff,
               (iVar13 * lVar8) / (long)(int)uVar4 & 0xffffffff);
    iVar2 = iVar2 + 10;
    for (pFVar11 = &lines->Text; ((FBrokenLines *)(pFVar11 + -1))->Width != -1;
        pFVar11 = pFVar11 + 2) {
      DCanvas::DrawText((DCanvas *)screen,SmallFont,0xb,iVar3 + 0x14,iVar2,pFVar11->Chars,0x400013a8
                        ,1,0x40001399,uVar6,0x4000139a,(ulong)uVar4,0);
      iVar2 = iVar2 + SmallFont->FontHeight + 1;
    }
    V_FreeBrokenLines(lines);
    return;
  }
  return;
}

Assistant:

void DBaseStatusBar::DrawLog ()
{
	int hudwidth, hudheight;

	if (CPlayer->LogText.IsNotEmpty())
	{
		// This uses the same scaling as regular HUD messages
		if (active_con_scaletext() == 0)
		{
			hudwidth = SCREENWIDTH / CleanXfac;
			hudheight = SCREENHEIGHT / CleanYfac;
		}
		else
		{
			hudwidth = SCREENWIDTH / active_con_scaletext();
			hudheight = SCREENHEIGHT / active_con_scaletext();
		}

		int linelen = hudwidth<640? Scale(hudwidth,9,10)-40 : 560;
		FBrokenLines *lines = V_BreakLines (SmallFont, linelen, CPlayer->LogText);
		int height = 20;

		for (int i = 0; lines[i].Width != -1; i++) height += SmallFont->GetHeight () + 1;

		int x,y,w;

		if (linelen<560)
		{
			x=hudwidth/20;
			y=hudheight/8;
			w=hudwidth-2*x;
		}
		else
		{
			x=(hudwidth>>1)-300;
			y=hudheight*3/10-(height>>1);
			if (y<0) y=0;
			w=600;
		}
		screen->Dim(0, 0.5f, Scale(x, SCREENWIDTH, hudwidth), Scale(y, SCREENHEIGHT, hudheight), 
							 Scale(w, SCREENWIDTH, hudwidth), Scale(height, SCREENHEIGHT, hudheight));
		x+=20;
		y+=10;
		for (int i = 0; lines[i].Width != -1; i++)
		{

			screen->DrawText (SmallFont, CR_UNTRANSLATED, x, y, lines[i].Text,
				DTA_KeepRatio, true,
				DTA_VirtualWidth, hudwidth, DTA_VirtualHeight, hudheight, TAG_DONE);
			y += SmallFont->GetHeight ()+1;
		}

		V_FreeBrokenLines (lines);
	}
}